

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O1

precise_unit units::tryUnitPartitioning(string *unit_string,uint64_t match_flags)

{
  pointer pcVar1;
  pointer pcVar2;
  undefined1 auVar3 [16];
  _Alloc_hider _Var4;
  char cVar5;
  unit_data uVar6;
  size_type sVar7;
  pointer pbVar8;
  uint uVar9;
  double dVar10;
  double match_flags_00;
  size_type __pos;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar11;
  double dVar12;
  byte bVar13;
  undefined8 uVar14;
  ulong uVar15;
  undefined4 extraout_XMM0_Dc;
  undefined4 uVar16;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dc_01;
  undefined4 extraout_XMM0_Dd;
  undefined4 uVar17;
  undefined4 extraout_XMM0_Dd_00;
  undefined4 extraout_XMM0_Dd_01;
  undefined1 auVar18 [16];
  pair<double,_unsigned_long> pVar19;
  precise_unit pVar20;
  size_t part;
  precise_unit bunit;
  precise_unit res;
  string ustring;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  valid;
  size_t local_268;
  precise_unit local_260;
  double local_250;
  undefined1 local_248 [8];
  undefined8 local_240;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_238;
  undefined1 local_228 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1f0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1e8;
  ulong local_1d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1c8;
  ulong uStack_1c0;
  undefined1 local_1b8 [16];
  string local_1a0;
  string local_180;
  ulong local_160;
  undefined8 local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  string local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  string local_d0;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
  pcVar1 = (unit_string->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_210,pcVar1,pcVar1 + unit_string->_M_string_length);
  pVar19 = getPrefixMultiplierWord(unit_string);
  dVar12 = pVar19.first;
  local_228._8_4_ = extraout_XMM0_Dc;
  local_228._0_8_ = dVar12;
  local_228._12_4_ = extraout_XMM0_Dd;
  local_250 = (double)match_flags;
  if ((dVar12 != 0.0) || (NAN(dVar12))) {
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              (&local_110,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)unit_string,
               pVar19.second,0xffffffffffffffff);
    tryUnitPartitioning();
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_b0,local_210._M_dataplus._M_p,
               local_210._M_dataplus._M_p + local_210._M_string_length);
    pVar20 = unit_from_string_internal(&local_b0,(uint64_t)local_250);
    uVar14 = pVar20._8_8_;
    dVar12 = pVar20.multiplier_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      local_250 = pVar20.multiplier_;
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
      dVar12 = local_250;
    }
    if (pVar20.base_units_ == (unit_data)0xfa94a488 && NAN(dVar12)) {
      uVar14 = 0xfa94a488;
      dVar12 = NAN;
      uVar16 = 0;
      uVar17 = 0;
    }
    else {
      uVar16 = local_228._8_4_;
      uVar17 = local_228._12_4_;
      dVar12 = local_228._0_8_ * dVar12;
    }
    local_228._8_4_ = uVar16;
    local_228._0_8_ = dVar12;
    local_228._12_4_ = uVar17;
    goto LAB_003f630b;
  }
  local_268 = (ulong)(*(unit_string->_M_dataplus)._M_p != 'N') * 2 + 1;
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
            (&local_110,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)unit_string,0,
             local_268);
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&local_210,&local_110);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
  }
  bVar13 = local_210._M_dataplus._M_p[local_210._M_string_length - 1];
  if (((bVar13 == 0x28) || (bVar13 == 0x7b)) || (bVar13 == 0x5b)) {
    local_268 = 1;
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::pop_back
              (&local_210);
  }
  uVar9 = (uint)(match_flags >> 0x25) & 7;
  local_1e8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_1e8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_1e8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if ((ulong)uVar9 <= unit_string->_M_string_length - local_268 &&
      local_268 < unit_string->_M_string_length - 1) {
    local_160 = match_flags | 0x400000000;
    local_228 = ZEXT816(0x7ff4000000000000);
    pbVar11 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    uVar14 = 0xfa94a488;
    local_1d0 = (ulong)uVar9;
    do {
      local_1f0 = pbVar11;
      if (local_1d0 <= local_210._M_string_length) {
        local_158 = uVar14;
        local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_130,local_210._M_dataplus._M_p,
                   local_210._M_dataplus._M_p + local_210._M_string_length);
        pVar20 = unit_quick_match(&local_130,match_flags);
        local_240 = pVar20._8_8_;
        local_248 = (undefined1  [8])pVar20.multiplier_;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_130._M_dataplus._M_p != &local_130.field_2) {
          operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
        }
        uVar14 = local_158;
        if (((NAN((double)local_248)) && (local_240._0_4_ == (unit_data)0xfa94a488)) &&
           ((2 < local_210._M_string_length && ((byte)(*local_210._M_dataplus._M_p + 0xbfU) < 0x1a))
           )) {
          *local_210._M_dataplus._M_p = *local_210._M_dataplus._M_p | 0x20;
          local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_180,local_210._M_dataplus._M_p,
                     local_210._M_dataplus._M_p + local_210._M_string_length);
          pVar20 = unit_quick_match(&local_180,match_flags);
          local_240 = pVar20._8_8_;
          local_248 = (undefined1  [8])pVar20.multiplier_;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_180._M_dataplus._M_p != &local_180.field_2) {
            operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1);
          }
        }
        if ((!NAN((double)local_248) && !NAN((double)local_248)) ||
           (local_240._0_4_ != (unit_data)0xfa94a488)) {
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          substr(&local_150,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)unit_string,
                 local_268,0xffffffffffffffff);
          pVar20 = unit_from_string_internal((string *)&local_150,local_160);
          local_260._8_8_ = pVar20._8_8_;
          local_260.multiplier_ = pVar20.multiplier_;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_150._M_dataplus._M_p != &local_150.field_2) {
            operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
          }
          local_1b8._8_8_ = 0;
          local_1b8._0_8_ = local_260.multiplier_;
          if ((!NAN(local_260.multiplier_) && !NAN(local_260.multiplier_)) ||
             (local_260.base_units_ != (unit_data)0xfa94a488)) {
            local_1c8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_248;
            if ((NAN((double)local_228._0_8_) || NAN((double)local_228._0_8_)) &&
               ((int)uVar14 == -0x56b5b78)) {
              uVar6 = detail::unit_data::operator*((unit_data *)&local_240,&local_260.base_units_);
              local_228._8_4_ = local_1b8._8_4_;
              local_228._0_8_ = local_1b8._0_8_ * (double)local_1c8;
              local_228._12_4_ = local_1b8._12_4_;
              uVar14 = CONCAT44(local_260.commodity_ | local_240._4_4_,uVar6);
            }
            else {
              uVar6 = detail::unit_data::operator*((unit_data *)&local_240,&local_260.base_units_);
              uVar9 = local_260.commodity_ | local_240._4_4_;
              uVar16 = local_1b8._12_4_;
              dVar12 = local_1b8._0_8_ * (double)local_1c8;
              local_1b8._8_4_ = local_1b8._8_4_;
              local_1b8._0_8_ = dVar12;
              local_1b8._12_4_ = uVar16;
              dVar12 = log10(dVar12);
              local_1c8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)((ulong)dVar12 & 0x7fffffffffffffff);
              uStack_1c0 = CONCAT44(extraout_XMM0_Dd_00,extraout_XMM0_Dc_00) & 0x7fffffffffffffff;
              dVar12 = log10((double)local_228._0_8_);
              uVar15 = -(ulong)((double)local_1c8 < ABS(dVar12));
              auVar18._0_8_ = ~uVar15 & local_228._0_8_;
              auVar18._8_8_ = ~uStack_1c0 & local_228._8_8_;
              auVar3._8_4_ = (int)(local_1b8._8_8_ & uStack_1c0);
              auVar3._0_8_ = local_1b8._0_8_ & uVar15;
              auVar3._12_4_ = (int)((local_1b8._8_8_ & uStack_1c0) >> 0x20);
              local_228 = auVar18 | auVar3;
              if ((double)local_1c8 < ABS(dVar12)) {
                uVar14 = CONCAT44(uVar9,uVar6);
              }
            }
          }
          CLI::std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&local_1e8,&local_210);
        }
      }
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      push_back(&local_210,(unit_string->_M_dataplus)._M_p[local_268]);
      sVar7 = local_210._M_string_length;
      _Var4._M_p = local_210._M_dataplus._M_p;
      __pos = local_268 + 1;
      bVar13 = local_210._M_dataplus._M_p[local_210._M_string_length - 1];
      local_268 = __pos;
      if (((bVar13 == 0x28) || (bVar13 == 0x5b)) || (pbVar11 = local_1f0, bVar13 == 0x7b)) {
        cVar5 = getMatchCharacter(bVar13);
        segmentcheck(unit_string,cVar5,&local_268);
        if ((_Var4._M_p[sVar7 - 1] == 0x28) &&
           (sVar7 = CLI::std::__cxx11::
                    basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find_first_of
                              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               unit_string,"({[*/",__pos,5), match_flags = (uint64_t)local_250,
           pbVar11 = local_1f0, sVar7 < local_268)) goto LAB_003f5e2c;
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                  (&local_110,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)unit_string,
                   0,local_268);
        tryUnitPartitioning();
        pbVar11 = local_1f0;
      }
      for (; ((match_flags = (uint64_t)local_250,
              bVar13 = local_210._M_dataplus._M_p[local_210._M_string_length - 1], bVar13 == 0x5f ||
              (bVar13 == 0x2d)) && (local_268 < unit_string->_M_string_length - 1));
          local_268 = local_268 + 1) {
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        push_back(&local_210,(unit_string->_M_dataplus)._M_p[local_268]);
        pbVar11 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  CONCAT71((int7)((ulong)pbVar11 >> 8),1);
      }
      if ((byte)(bVar13 - 0x30) < 10) {
        for (; (local_268 < unit_string->_M_string_length - 1 &&
               (cVar5 = (unit_string->_M_dataplus)._M_p[local_268],
               cVar5 == '.' || (byte)(cVar5 - 0x30U) < 10)); local_268 = local_268 + 1) {
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          push_back(&local_210,cVar5);
        }
      }
      if ((unit_string->_M_string_length - 1 <= local_268) ||
         (unit_string->_M_string_length - local_268 < local_1d0)) goto LAB_003f5e2c;
    } while( true );
  }
  local_228._0_4_ = 0;
  local_228._4_4_ = 0x7ff40000;
  local_228._8_4_ = 0;
  local_228._12_4_ = 0;
  bVar13 = 0;
  uVar14 = 0xfa94a488;
LAB_003f5e3d:
  if ((NAN((double)CONCAT44(local_228._4_4_,local_228._0_4_)) ||
       NAN((double)CONCAT44(local_228._4_4_,local_228._0_4_))) && ((int)uVar14 == -0x56b5b78)) {
    if ((uVar9 < 2) && ((unit_string->_M_dataplus)._M_p[unit_string->_M_string_length - 1] == 'm'))
    {
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_d0,local_210._M_dataplus._M_p,
                 local_210._M_dataplus._M_p + local_210._M_string_length);
      pVar20 = unit_quick_match(&local_d0,match_flags);
      local_240 = pVar20._8_8_;
      local_248 = (undefined1  [8])pVar20.multiplier_;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
      }
      local_228._8_8_ = 0;
      local_228._0_8_ = local_248;
      if ((!NAN((double)local_248) && !NAN((double)local_248)) ||
         (local_240._0_4_ != (unit_data)0xfa94a488)) {
        uVar6 = detail::unit_data::operator*((unit_data *)&local_240,(unit_data *)((long)&m + 4));
        uVar14 = CONCAT44(local_240._4_4_,uVar6);
        goto LAB_003f62fe;
      }
    }
    if (uVar9 < 3 && (bVar13 & 1) == 0) {
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                (&local_50,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)unit_string,0,
                 2);
      pVar20 = unit_quick_match((string *)&local_50,match_flags);
      local_260._8_8_ = pVar20._8_8_;
      local_260.multiplier_ = pVar20.multiplier_;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      pbVar8 = local_1e8.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((NAN(local_260.multiplier_) || NAN(local_260.multiplier_)) &&
         (local_260.base_units_ == (unit_data)0xfa94a488)) {
        if (unit_string->_M_string_length == 4) {
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          substr(&local_70,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)unit_string,2,
                 2);
          pVar20 = unit_quick_match((string *)&local_70,match_flags);
          local_260._8_8_ = pVar20._8_8_;
          local_260.multiplier_ = pVar20.multiplier_;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_70._M_dataplus._M_p != &local_70.field_2) {
            operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
          }
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          substr(&local_90,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)unit_string,0,
                 2);
          pVar20 = unit_from_string_internal((string *)&local_90,match_flags);
          local_240 = pVar20._8_8_;
          local_248 = (undefined1  [8])pVar20.multiplier_;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_90._M_dataplus._M_p != &local_90.field_2) {
            operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
          }
          if ((!NAN((double)local_248) && !NAN((double)local_248)) ||
             (local_240._0_4_ != (unit_data)0xfa94a488)) {
            pVar20 = precise_unit::operator*(&local_260,(precise_unit *)local_248);
            uVar14 = pVar20._8_8_;
            local_228._8_4_ = extraout_XMM0_Dc_01;
            local_228._0_8_ = pVar20.multiplier_;
            local_228._12_4_ = extraout_XMM0_Dd_01;
            goto LAB_003f62fe;
          }
        }
      }
      else {
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_248,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)unit_string,
                   0,2);
        CLI::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::_M_insert_rval(&local_1e8,(const_iterator)pbVar8,(value_type *)local_248);
        if (local_248 != (undefined1  [8])&local_238) {
          operator_delete((void *)local_248,local_238._M_allocated_capacity + 1);
        }
      }
    }
    pbVar8 = local_1e8.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((uVar9 < 2) && ((cVar5 = *(unit_string->_M_dataplus)._M_p, cVar5 == 'V' || (cVar5 == 'A'))))
    {
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_248,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)unit_string,0,
                 1);
      CLI::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::_M_insert_rval(&local_1e8,(const_iterator)pbVar8,(value_type *)local_248);
      if (local_248 != (undefined1  [8])&local_238) {
        operator_delete((void *)local_248,local_238._M_allocated_capacity + 1);
      }
    }
    pbVar11 = local_1e8.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish + -1;
    pbVar8 = local_1e8.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (local_1e8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start < pbVar11 &&
        local_1e8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_1e8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      do {
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::swap
                  (pbVar8,pbVar11);
        pbVar8 = pbVar8 + 1;
        pbVar11 = pbVar11 + -1;
      } while (pbVar8 < pbVar11);
    }
    local_228 = ZEXT816(0x7ff4000000000000);
    local_1f0 = local_1e8.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    if (local_1e8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_1e8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      dVar10 = (double)((ulong)local_250 | 0x6000000000);
      pbVar8 = local_1e8.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      dVar12 = local_250;
      do {
        local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
        pcVar2 = (pbVar8->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_1a0,pcVar2,pcVar2 + pbVar8->_M_string_length);
        pVar20 = unit_quick_match(&local_1a0,(uint64_t)dVar12);
        local_240 = pVar20._8_8_;
        local_248 = (undefined1  [8])pVar20.multiplier_;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
          operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
        }
        uVar15 = pbVar8->_M_string_length;
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                  (&local_f0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)unit_string,
                   pbVar8->_M_string_length,0xffffffffffffffff);
        dVar12 = local_250;
        match_flags_00 = dVar10;
        if (3 < uVar15) {
          match_flags_00 = local_250;
        }
        pVar20 = unit_from_string_internal((string *)&local_f0,(uint64_t)match_flags_00);
        local_260._8_8_ = pVar20._8_8_;
        local_260.multiplier_ = pVar20.multiplier_;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
          operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
        }
        if ((!NAN(local_260.multiplier_) && !NAN(local_260.multiplier_)) ||
           (local_260.base_units_ != (unit_data)0xfa94a488)) {
          local_250 = local_260.multiplier_;
          local_228._0_8_ = local_248;
          uVar6 = detail::unit_data::operator*((unit_data *)&local_240,&local_260.base_units_);
          uVar14 = CONCAT44(local_260.commodity_ | local_240._4_4_,uVar6);
          local_228._8_8_ = 0;
          local_228._0_8_ = local_250 * (double)local_228._0_8_;
          goto LAB_003f62fe;
        }
        pbVar8 = pbVar8 + 1;
      } while (pbVar8 != local_1f0);
    }
    uVar14 = 0xfa94a488;
  }
LAB_003f62fe:
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1e8);
LAB_003f630b:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_dataplus._M_p != &local_210.field_2) {
    operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
  }
  pVar20.base_units_ = (unit_data)(int)uVar14;
  pVar20.commodity_ = (int)((ulong)uVar14 >> 0x20);
  pVar20.multiplier_ = (double)local_228._0_8_;
  return pVar20;
LAB_003f5e2c:
  bVar13 = (byte)pbVar11;
  uVar9 = (uint)local_1d0;
  goto LAB_003f5e3d;
}

Assistant:

static precise_unit tryUnitPartitioning(
    const std::string& unit_string,
    std::uint64_t match_flags)
{
    std::string ustring = unit_string;

    auto mret = getPrefixMultiplierWord(unit_string);
    if (mret.first != 0.0) {
        ustring = unit_string.substr(mret.second);

        auto retunit = unit_from_string_internal(ustring, match_flags);
        if (is_valid(retunit)) {
            return {mret.first, retunit};
        }
        return precise::invalid;
    }

    // a newton(N) in front is somewhat common
    // try a round with just a quick partition
    size_t part = (unit_string.front() == 'N') ? 1 : 3;
    ustring = unit_string.substr(0, part);
    if (ustring.back() == '(' || ustring.back() == '[' ||
        ustring.back() == '{') {
        part = 1;
        ustring.pop_back();
    }
    auto minPartitionSize = getMinPartitionSize(match_flags);
    std::vector<std::string> valid;
    precise_unit possible = precise::invalid;
    bool hasSep{false};
    while (part < unit_string.size() - 1) {
        if (unit_string.size() - part < minPartitionSize) {
            break;
        }
        if (ustring.size() >= minPartitionSize) {
            auto res = unit_quick_match(ustring, match_flags);
            if (!is_valid(res) && ustring.size() >= 3) {
                if (ustring.front() >= 'A' &&
                    ustring.front() <= 'Z') {  // check the lower case version
                                               // since we skipped partitioning
                                               // when we did this earlier
                    ustring[0] += 32;
                    res = unit_quick_match(ustring, match_flags);
                }
            }
            if (is_valid(res)) {
                auto bunit = unit_from_string_internal(
                    unit_string.substr(part),
                    match_flags | skip_partition_check);
                if (is_valid(bunit)) {
                    if (!is_valid(possible)) {
                        possible = res * bunit;
                    } else {
                        auto temp = res * bunit;
                        if (std::abs(log10(temp.multiplier())) <
                            std::abs(log10(possible.multiplier()))) {
                            possible = temp;
                        }
                    }
                }
                valid.push_back(ustring);
            }
        }
        ustring.push_back(unit_string[part]);
        ++part;
        if (ustring.back() == '(' || ustring.back() == '[' ||
            ustring.back() == '{') {
            auto start = part;
            segmentcheck(unit_string, getMatchCharacter(ustring.back()), part);
            if (ustring.back() == '(') {
                if (unit_string.find_first_of("({[*/", start) < part) {
                    // this implies that the contents of the parenthesis
                    // must be a standalone segment and should not be
                    // included in a check
                    break;
                }
            }
            ustring = unit_string.substr(0, part);
        }
        while ((ustring.back() == '_' || ustring.back() == '-') &&
               (part < unit_string.size() - 1)) {
            hasSep = true;
            ustring.push_back(unit_string[part]);
            ++part;
        }
        if (isDigitCharacter(ustring.back())) {
            while ((part < unit_string.size() - 1) &&
                   (unit_string[part] == '.' ||
                    isDigitCharacter(unit_string[part]))) {
                ustring.push_back(unit_string[part]);
                ++part;
            }
        }
    }
    if (is_valid(possible)) {
        return possible;
    }
    if (minPartitionSize <= 1) {
        // meter is somewhat common ending so just check that one too
        if (unit_string.back() == 'm') {
            auto res = unit_quick_match(ustring, match_flags);
            if (is_valid(res)) {
                return res * m;
            }
        }
    }
    if (minPartitionSize <= 2 && !hasSep) {
        // now do a quick check with a 2 character string since we skipped that
        // earlier
        auto qm2 = unit_quick_match(unit_string.substr(0, 2), match_flags);
        if (is_valid(qm2)) {
            valid.insert(valid.begin(), unit_string.substr(0, 2));
        } else if (unit_string.size() == 4) {  // length of 4 is a bit odd so
                                               // check the back two characters
                                               // for a quick match
            qm2 = unit_quick_match(unit_string.substr(2, 2), match_flags);
            auto bunit = unit_from_string_internal(
                unit_string.substr(0, 2), match_flags);
            if (is_valid(bunit)) {
                return qm2 * bunit;
            }
        }
    }
    if (minPartitionSize <= 1) {
        // now pick off a couple 1 character units
        if (unit_string.front() == 'V' || unit_string.front() == 'A') {
            valid.insert(valid.begin(), unit_string.substr(0, 1));
        }
    }
    // start with the biggest
    std::reverse(valid.begin(), valid.end());
    for (auto& vd : valid) {
        auto res = unit_quick_match(vd, match_flags);
        auto nmatch_flags = (vd.size() > 3) ?
            match_flags :
            match_flags | minimum_partition_size3;
        auto bunit = unit_from_string_internal(
            unit_string.substr(vd.size()), nmatch_flags);
        if (is_valid(bunit)) {
            return res * bunit;
        }
    }

    return precise::invalid;
}